

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_arena.pb.cc
# Opt level: O2

void proto2_arena_unittest::NestedMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Nullable<const_char_*> failure_msg;
  NestedMessage *_this;
  NestedMessage *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (NestedMessage *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_arena_unittest::NestedMessage_const*,proto2_arena_unittest::NestedMessage*>
                          ((NestedMessage **)local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 1) != 0) {
      *(int *)((long)&local_20->field_0 + 8) = (int)from_msg[1]._internal_metadata_.ptr_;
    }
    (local_20->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_20->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_20->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_arena.pb.cc"
             ,0x14a,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18);
}

Assistant:

void NestedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<NestedMessage*>(&to_msg);
  auto& from = static_cast<const NestedMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_arena_unittest.NestedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_impl_.d_ = from._impl_.d_;
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}